

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.h
# Opt level: O1

void __thiscall SVGChart::LinTickIterator::~LinTickIterator(LinTickIterator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TickIterator)._vptr_TickIterator = (_func_int **)&PTR__LinTickIterator_001129a8;
  pcVar2 = (this->mFormatString)._M_dataplus._M_p;
  paVar1 = &(this->mFormatString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

LinTickIterator ():mCurrentTick (0), mDelta (0){}